

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_get_frame_short(stb_vorbis *f,int num_c,short **buffer,int num_samples)

{
  int local_34;
  float **ppfStack_30;
  int len;
  float **output;
  short **ppsStack_20;
  int num_samples_local;
  short **buffer_local;
  stb_vorbis *psStack_10;
  int num_c_local;
  stb_vorbis *f_local;
  
  ppfStack_30 = (float **)0x0;
  output._4_4_ = num_samples;
  ppsStack_20 = buffer;
  buffer_local._4_4_ = num_c;
  psStack_10 = f;
  local_34 = stb_vorbis_get_frame_float(f,(int *)0x0,&stack0xffffffffffffffd0);
  if (output._4_4_ < local_34) {
    local_34 = output._4_4_;
  }
  if (local_34 != 0) {
    convert_samples_short
              (buffer_local._4_4_,ppsStack_20,0,psStack_10->channels,ppfStack_30,0,local_34);
  }
  return local_34;
}

Assistant:

int stb_vorbis_get_frame_short(stb_vorbis *f, int num_c, short **buffer, int num_samples)
{
   float **output = NULL;
   int len = stb_vorbis_get_frame_float(f, NULL, &output);
   if (len > num_samples) len = num_samples;
   if (len)
      convert_samples_short(num_c, buffer, 0, f->channels, output, 0, len);
   return len;
}